

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeSetEtaFixedStepBounds(void *cvode_mem,sunrealtype eta_min_fx,sunrealtype eta_max_fx)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x18e,"CVodeSetEtaFixedStepBounds",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *(ulong *)((long)cvode_mem + 0x5d0) =
         ~-(ulong)(eta_min_fx < 0.0) & ~-(ulong)(1.0 <= eta_min_fx) & (ulong)eta_min_fx;
    if (eta_max_fx <= 1.0) {
      *(undefined8 *)((long)cvode_mem + 0x5d8) = 0x3ff8000000000000;
    }
    else {
      *(sunrealtype *)((long)cvode_mem + 0x5d8) = eta_max_fx;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaFixedStepBounds(void* cvode_mem, sunrealtype eta_min_fx,
                               sunrealtype eta_max_fx)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* set allowed value or use default */
  if (eta_min_fx < ZERO || eta_min_fx >= ONE)
  {
    cv_mem->cv_eta_min_fx = ETA_MIN_FX_DEFAULT;
  }
  else { cv_mem->cv_eta_min_fx = eta_min_fx; }

  if (eta_max_fx <= ONE) { cv_mem->cv_eta_max_fx = ETA_MAX_FX_DEFAULT; }
  else { cv_mem->cv_eta_max_fx = eta_max_fx; }

  return (CV_SUCCESS);
}